

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnsweringCommentsMinigame.cpp
# Opt level: O0

void __thiscall AnsweringCommentsMinigame::start(AnsweringCommentsMinigame *this)

{
  result_type_conflict1 rVar1;
  AnsweringCommentsMinigame *this_local;
  
  this->titleFadeoutTimer = 0.0;
  rVar1 = std::uniform_real_distribution<float>::operator()(&this->nextCommentDistrib,&this->engine)
  ;
  this->nextCommentTimer = rVar1;
  return;
}

Assistant:

void AnsweringCommentsMinigame::start() {
    titleFadeoutTimer = 0.0f;
    nextCommentTimer = nextCommentDistrib(engine);
}